

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::CommandLineInterface::VerifyInputFilesInDescriptors
          (CommandLineInterface *this,DescriptorDatabase *database)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  string *psVar6;
  undefined1 local_138 [8];
  FileDescriptorProto file_descriptor;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input_file;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  DescriptorDatabase *database_local;
  CommandLineInterface *this_local;
  
  __end2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->input_files_);
  input_file = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(&this->input_files_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&input_file), bVar1) {
    file_descriptor.field_0._224_8_ =
         __gnu_cxx::
         __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end2);
    FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_138);
    uVar2 = (*database->_vptr_DescriptorDatabase[2])
                      (database,file_descriptor.field_0._224_8_,(FileDescriptorProto *)local_138);
    if ((uVar2 & 1) == 0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Could not find file in descriptor database: ")
      ;
      poVar4 = std::operator<<(poVar4,(string *)file_descriptor.field_0._224_8_);
      poVar4 = std::operator<<(poVar4,": ");
      pcVar5 = strerror(2);
      poVar4 = std::operator<<(poVar4,pcVar5);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = 0;
      bVar1 = true;
    }
    else if (((this->disallow_services_ & 1U) == 0) ||
            (iVar3 = FileDescriptorProto::service_size((FileDescriptorProto *)local_138), iVar3 < 1)
            ) {
      bVar1 = false;
    }
    else {
      psVar6 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)local_138);
      poVar4 = std::operator<<((ostream *)&std::cerr,(string *)psVar6);
      poVar4 = std::operator<<(poVar4,
                               ": This file contains services, but --disallow_services was used.");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = 0;
      bVar1 = true;
    }
    FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_138);
    if (bVar1) goto LAB_00142db3;
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  }
  this_local._7_1_ = 1;
LAB_00142db3:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CommandLineInterface::VerifyInputFilesInDescriptors(
    DescriptorDatabase* database) {
  for (const auto& input_file : input_files_) {
    FileDescriptorProto file_descriptor;
    if (!database->FindFileByName(input_file, &file_descriptor)) {
      std::cerr << "Could not find file in descriptor database: " << input_file
                << ": " << strerror(ENOENT) << std::endl;
      return false;
    }

    // Enforce --disallow_services.
    if (disallow_services_ && file_descriptor.service_size() > 0) {
      std::cerr << file_descriptor.name()
                << ": This file contains services, but "
                   "--disallow_services was used."
                << std::endl;
      return false;
    }
  }
  return true;
}